

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O3

void P_Attach3dMidtexLinesToSector(sector_t *sector,int lineid,int tag,bool ceiling)

{
  byte *pbVar1;
  extsector_t *peVar2;
  line_t **pplVar3;
  sector_t **ppsVar4;
  line_t *plVar5;
  int *piVar6;
  splane *psVar7;
  sector_t *psVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  void *__s;
  void *__s_00;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  TArray<sector_t_*,_sector_t_*> *pTVar19;
  FSectorTagIterator it;
  FSectorTagIterator local_48;
  TArray<line_t_*,_line_t_*> *local_40;
  TArray<sector_t_*,_sector_t_*> *local_38;
  
  if (tag != 0 || lineid != 0) {
    peVar2 = sector->e;
    pTVar19 = &(&(peVar2->Midtex).Floor)[ceiling].AttachedSectors;
    iVar10 = numlines + 0xe;
    if (-1 < numlines + 7) {
      iVar10 = numlines + 7;
    }
    __s = operator_new__((long)(iVar10 >> 3));
    iVar12 = numsectors + 0xe;
    if (-1 < numsectors + 7) {
      iVar12 = numsectors + 7;
    }
    __s_00 = operator_new__((long)(iVar12 >> 3));
    memset(__s,0,(long)(iVar10 >> 3));
    memset(__s_00,0,(long)(iVar12 >> 3));
    plVar5 = lines;
    local_40 = &(&(peVar2->Midtex).Floor)[ceiling].AttachedLines;
    uVar13 = (ulong)(&(peVar2->Midtex).Floor)[ceiling].AttachedLines.Count;
    if (uVar13 != 0) {
      pplVar3 = local_40->Array;
      uVar15 = 0;
      do {
        lVar17 = ((long)pplVar3[uVar15] - (long)plVar5 >> 3) * -0x79435e50d79435e5;
        pbVar1 = (byte *)((long)__s + (long)((int)lVar17 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar17 & 7));
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar13);
    }
    psVar8 = sectors;
    uVar15 = (ulong)(&(peVar2->Midtex).Floor)[ceiling].AttachedSectors.Count;
    if (uVar15 != 0) {
      ppsVar4 = ((TArray<sector_t_*,_sector_t_*> *)&pTVar19->Array)->Array;
      uVar16 = 0;
      do {
        lVar17 = ((long)ppsVar4[uVar16] - (long)psVar8 >> 3) * 0x4fcace213f2b3885;
        pbVar1 = (byte *)((long)__s_00 + (long)((int)lVar17 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar17 & 7));
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar15);
    }
    if (uVar13 != 0) {
      (&(peVar2->Midtex).Floor)[ceiling].AttachedLines.Count = 0;
    }
    if (uVar15 != 0) {
      (&(peVar2->Midtex).Floor)[ceiling].AttachedSectors.Count = 0;
    }
    local_38 = pTVar19;
    if (tag == 0) {
      local_48.start = tagManager.IDHashFirst[lineid & 0xff];
      local_48.searchtag = lineid;
      uVar11 = FLineIdIterator::Next((FLineIdIterator *)&local_48);
      if (-1 < (int)uVar11) {
        do {
          if (((lines[uVar11].frontsector != (sector_t *)0x0) &&
              (lines[uVar11].backsector != (sector_t *)0x0)) &&
             ((lines[uVar11].flags & 0x200000) != 0)) {
            pbVar1 = (byte *)((long)__s + (ulong)(uVar11 >> 3));
            *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar11 & 7));
          }
          uVar11 = FLineIdIterator::Next((FLineIdIterator *)&local_48);
        } while (-1 < (int)uVar11);
      }
    }
    else {
      local_48.start = tagManager.TagHashFirst[tag & 0xff];
      local_48.searchtag = tag;
      uVar11 = FSectorTagIterator::Next(&local_48);
      pTVar19 = local_38;
      while (local_38 = pTVar19, -1 < (int)uVar11) {
        if (0 < sectors[uVar11].linecount) {
          lVar17 = 0;
          do {
            plVar5 = sectors[uVar11].lines[lVar17];
            if (((lineid == 0) || (bVar9 = FTagManager::LineHasID(&tagManager,plVar5,lineid), bVar9)
                ) && ((plVar5->frontsector != (sector_t *)0x0 &&
                      ((plVar5->backsector != (sector_t *)0x0 && ((plVar5->flags & 0x200000) != 0)))
                      ))) {
              lVar18 = ((long)plVar5 - (long)lines >> 3) * -0x79435e50d79435e5;
              pbVar1 = (byte *)((long)__s + (long)((int)lVar18 >> 3));
              *pbVar1 = *pbVar1 | (byte)(1 << ((byte)lVar18 & 7));
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < sectors[uVar11].linecount);
        }
        uVar11 = FSectorTagIterator::Next(&local_48);
        pTVar19 = local_38;
      }
    }
    if (0 < numlines) {
      lVar17 = 0;
      uVar13 = 0;
      iVar10 = numlines;
      do {
        if ((*(byte *)((long)__s + (uVar13 >> 3 & 0x1fffffff)) >> ((uint)uVar13 & 7) & 1) != 0) {
          piVar6 = lines->args;
          TArray<line_t_*,_line_t_*>::Grow(local_40,1);
          uVar11 = pTVar19[1].Count;
          pTVar19[1].Array[uVar11] = (sector_t *)((long)piVar6 + lVar17 + -0x2c);
          pTVar19[1].Count = uVar11 + 1;
          plVar5 = lines;
          psVar8 = sectors;
          iVar10 = numsectors;
          iVar12 = (int)((ulong)(*(long *)((long)lines->bbox + lVar17 + 0x20) - (long)sectors) >> 3)
          ;
          iVar14 = iVar12 * 0x3f2b3885;
          if (numsectors == iVar14 ||
              SBORROW4(numsectors,iVar14) != numsectors + iVar12 * -0x3f2b3885 < 0) {
            __assert_fail("v < numsectors",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_3dmidtex.cpp"
                          ,0xc3,"void P_Attach3dMidtexLinesToSector(sector_t *, int, int, bool)");
          }
          pbVar1 = (byte *)((long)__s_00 + (long)(iVar14 >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)iVar14 & 7));
          iVar14 = (int)((ulong)(*(long *)((long)plVar5->bbox + lVar17 + 0x28) - (long)psVar8) >> 3)
          ;
          iVar12 = iVar14 * 0x3f2b3885;
          if (iVar10 == iVar12 || SBORROW4(iVar10,iVar12) != iVar10 + iVar14 * -0x3f2b3885 < 0) {
            __assert_fail("v < numsectors",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_3dmidtex.cpp"
                          ,199,"void P_Attach3dMidtexLinesToSector(sector_t *, int, int, bool)");
          }
          pbVar1 = (byte *)((long)__s_00 + (long)(iVar12 >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)iVar12 & 7));
          iVar10 = numlines;
        }
        uVar13 = uVar13 + 1;
        lVar17 = lVar17 + 0x98;
      } while ((long)uVar13 < (long)iVar10);
    }
    pTVar19 = local_38;
    if (0 < numsectors) {
      lVar17 = 0;
      uVar13 = 0;
      iVar10 = numsectors;
      do {
        if ((*(byte *)((long)__s_00 + (uVar13 >> 3 & 0x1fffffff)) >> ((uint)uVar13 & 7) & 1) != 0) {
          psVar7 = sectors->planes;
          TArray<sector_t_*,_sector_t_*>::Grow(pTVar19,1);
          uVar11 = pTVar19->Count;
          pTVar19->Array[uVar11] = (sector_t *)((long)&(psVar7->xform).xOffs + lVar17);
          pTVar19->Count = uVar11 + 1;
          iVar10 = numsectors;
        }
        uVar13 = uVar13 + 1;
        lVar17 = lVar17 + 0x268;
      } while ((long)uVar13 < (long)iVar10);
    }
    operator_delete__(__s);
    operator_delete__(__s_00);
  }
  return;
}

Assistant:

void P_Attach3dMidtexLinesToSector(sector_t *sector, int lineid, int tag, bool ceiling)
{
	int v;

	if (lineid == 0 && tag == 0)
	{
		// invalid set of parameters
		return;
	}

	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	// Bit arrays that mark whether a line or sector is to be attached.
	BYTE *found_lines = new BYTE[(numlines+7)/8];
	BYTE *found_sectors = new BYTE[(numsectors+7)/8];

	memset(found_lines, 0, sizeof (BYTE) * ((numlines+7)/8));
	memset(found_sectors, 0, sizeof (BYTE) * ((numsectors+7)/8));

	// mark all lines and sectors that are already attached to this one
	// and clear the arrays. The old data will be re-added automatically
	// from the marker arrays.
	for (unsigned i=0; i < scrollplane.AttachedLines.Size(); i++)
	{
		int line = int(scrollplane.AttachedLines[i] - lines);
		found_lines[line>>3] |= 1 << (line&7);
	}

	for (unsigned i=0; i < scrollplane.AttachedSectors.Size(); i++)
	{
		int sec = int(scrollplane.AttachedSectors[i] - sectors);
		found_sectors[sec>>3] |= 1 << (sec&7);
	}

	scrollplane.AttachedLines.Clear();
	scrollplane.AttachedSectors.Clear();

	if (tag == 0)
	{
		FLineIdIterator itr(lineid);
		int line;
		while ((line = itr.Next()) >= 0)
		{
			line_t *ln = &lines[line];

			if (ln->frontsector == NULL || ln->backsector == NULL || !(ln->flags & ML_3DMIDTEX))
			{
				// Only consider two-sided lines with the 3DMIDTEX flag
				continue;
			}
			found_lines[line>>3] |= 1 << (line&7);
		}
	}
	else
	{
		FSectorTagIterator it(tag);
		int sec;
		while ((sec = it.Next()) >= 0)
		{
			for (int line = 0; line < sectors[sec].linecount; line ++)
			{
				line_t *ln = sectors[sec].lines[line];

				if (lineid != 0 && !tagManager.LineHasID(ln, lineid)) continue;

				if (ln->frontsector == NULL || ln->backsector == NULL || !(ln->flags & ML_3DMIDTEX))
				{
					// Only consider two-sided lines with the 3DMIDTEX flag
					continue;
				}
				int lineno = int(ln-lines);
				found_lines[lineno>>3] |= 1 << (lineno&7);
			}
		}
	}


	for(int i=0; i < numlines; i++)
	{
		if (found_lines[i>>3] & (1 << (i&7)))
		{
			scrollplane.AttachedLines.Push(&lines[i]);

			v = int(lines[i].frontsector - sectors);
			assert(v < numsectors);
			found_sectors[v>>3] |= 1 << (v&7);

			v = int(lines[i].backsector - sectors);
			assert(v < numsectors);
			found_sectors[v>>3] |= 1 << (v&7);
		}
	}

	for (int i=0; i < numsectors; i++)
	{
		if (found_sectors[i>>3] & (1 << (i&7)))
		{
			scrollplane.AttachedSectors.Push(&sectors[i]);
		}
	}

	delete[] found_lines;
	delete[] found_sectors;
}